

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trsort.c
# Opt level: O0

saint_t tr_ilg(saidx64_t n)

{
  saint_t local_24;
  saint_t local_20;
  saint_t local_1c;
  saint_t local_18;
  saint_t local_14;
  saint_t local_10;
  saint_t local_c;
  saidx64_t n_local;
  
  if (n >> 0x20 == 0) {
    if ((n & 0xffff0000U) == 0) {
      if ((n & 0xff00U) == 0) {
        local_24 = lg_table[n & 0xff];
      }
      else {
        local_24 = lg_table[n >> 8 & 0xff] + 8;
      }
      local_20 = local_24;
    }
    else {
      if ((n & 0xff000000U) == 0) {
        local_1c = lg_table[n >> 0x10 & 0xff] + 0x10;
      }
      else {
        local_1c = lg_table[n >> 0x18 & 0xff] + 0x18;
      }
      local_20 = local_1c;
    }
    local_18 = local_20;
  }
  else {
    if (n >> 0x30 == 0) {
      if (n >> 0x28 == 0) {
        local_14 = lg_table[n >> 0x20 & 0xff] + 0x20;
      }
      else {
        local_14 = lg_table[n >> 0x28 & 0xff] + 0x28;
      }
      local_10 = local_14;
    }
    else {
      if (n >> 0x38 == 0) {
        local_c = lg_table[n >> 0x30 & 0xff] + 0x30;
      }
      else {
        local_c = lg_table[n >> 0x38 & 0xff] + 0x38;
      }
      local_10 = local_c;
    }
    local_18 = local_10;
  }
  return local_18;
}

Assistant:

static INLINE
saint_t
tr_ilg(saidx_t n) {
#if defined(BUILD_DIVSUFSORT64)
  return (n >> 32) ?
          ((n >> 48) ?
            ((n >> 56) ?
              56 + lg_table[(n >> 56) & 0xff] :
              48 + lg_table[(n >> 48) & 0xff]) :
            ((n >> 40) ?
              40 + lg_table[(n >> 40) & 0xff] :
              32 + lg_table[(n >> 32) & 0xff])) :
          ((n & 0xffff0000) ?
            ((n & 0xff000000) ?
              24 + lg_table[(n >> 24) & 0xff] :
              16 + lg_table[(n >> 16) & 0xff]) :
            ((n & 0x0000ff00) ?
               8 + lg_table[(n >>  8) & 0xff] :
               0 + lg_table[(n >>  0) & 0xff]));
#else
  return (n & 0xffff0000) ?
          ((n & 0xff000000) ?
            24 + lg_table[(n >> 24) & 0xff] :
            16 + lg_table[(n >> 16) & 0xff]) :
          ((n & 0x0000ff00) ?
             8 + lg_table[(n >>  8) & 0xff] :
             0 + lg_table[(n >>  0) & 0xff]);
#endif
}